

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int BrotliEnsureRingBuffer(BrotliDecoderStateInternal *s)

{
  uint8_t *__src;
  uint8_t *puVar1;
  uint8_t *old_ringbuffer;
  BrotliDecoderStateInternal *s_local;
  
  __src = s->ringbuffer;
  if (s->ringbuffer_size == s->new_ringbuffer_size) {
    s_local._4_4_ = 1;
  }
  else {
    puVar1 = (uint8_t *)
             (*s->alloc_func)(s->memory_manager_opaque,(long)s->new_ringbuffer_size + 0x2a);
    s->ringbuffer = puVar1;
    if (s->ringbuffer == (uint8_t *)0x0) {
      s->ringbuffer = __src;
      s_local._4_4_ = 0;
    }
    else {
      s->ringbuffer[s->new_ringbuffer_size + -2] = '\0';
      s->ringbuffer[s->new_ringbuffer_size + -1] = '\0';
      if (__src != (uint8_t *)0x0) {
        memcpy(s->ringbuffer,__src,(long)s->pos);
        (*s->free_func)(s->memory_manager_opaque,__src);
      }
      s->ringbuffer_size = s->new_ringbuffer_size;
      s->ringbuffer_mask = s->new_ringbuffer_size + -1;
      s->ringbuffer_end = s->ringbuffer + s->ringbuffer_size;
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE BrotliEnsureRingBuffer(
    BrotliDecoderState* s) {
  uint8_t* old_ringbuffer = s->ringbuffer;
  if (s->ringbuffer_size == s->new_ringbuffer_size) {
    return BROTLI_TRUE;
  }

  s->ringbuffer = (uint8_t*)BROTLI_DECODER_ALLOC(s,
      (size_t)(s->new_ringbuffer_size) + kRingBufferWriteAheadSlack);
  if (s->ringbuffer == 0) {
    /* Restore previous value. */
    s->ringbuffer = old_ringbuffer;
    return BROTLI_FALSE;
  }
  s->ringbuffer[s->new_ringbuffer_size - 2] = 0;
  s->ringbuffer[s->new_ringbuffer_size - 1] = 0;

  if (!!old_ringbuffer) {
    memcpy(s->ringbuffer, old_ringbuffer, (size_t)s->pos);
    BROTLI_DECODER_FREE(s, old_ringbuffer);
  }

  s->ringbuffer_size = s->new_ringbuffer_size;
  s->ringbuffer_mask = s->new_ringbuffer_size - 1;
  s->ringbuffer_end = s->ringbuffer + s->ringbuffer_size;

  return BROTLI_TRUE;
}